

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

qint64 __thiscall QProcess::readData(QProcess *this,char *data,qint64 maxlen)

{
  if (maxlen != 0) {
    return -(ulong)(*(char *)((long)&(this->super_QIODevice).super_QObject.d_ptr.d[8].children.d.ptr
                             + 4) == '\0');
  }
  return 0;
}

Assistant:

qint64 QProcess::readData(char *data, qint64 maxlen)
{
    Q_D(QProcess);
    Q_UNUSED(data);
    if (!maxlen)
        return 0;
    if (d->processState == QProcess::NotRunning)
        return -1;              // EOF
    return 0;
}